

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::ValidationError::~ValidationError(ValidationError *this)

{
  Error::~Error((Error *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

explicit ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}